

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O3

void png_image_free(png_imagep image)

{
  if (((image != (png_imagep)0x0) && (image->opaque != (png_controlp)0x0)) &&
     (image->opaque->error_buf == (png_voidp)0x0)) {
    png_safe_execute(image,png_image_free_function,image);
    image->opaque = (png_controlp)0x0;
  }
  return;
}

Assistant:

void PNGAPI
png_image_free(png_imagep image)
{
   /* Safely call the real function, but only if doing so is safe at this point
    * (if not inside an error handling context).  Otherwise assume
    * png_safe_execute will call this API after the return.
    */
   if (image != NULL && image->opaque != NULL &&
      image->opaque->error_buf == NULL)
   {
      /* Ignore errors here: */
      (void)png_safe_execute(image, png_image_free_function, image);
      image->opaque = NULL;
   }
}